

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homology.h
# Opt level: O3

void print_homology_usage(bool no_filtration)

{
  pointer pcVar1;
  pointer pbVar2;
  ostream *poVar3;
  long *plVar4;
  pointer pbVar5;
  undefined7 in_register_00000039;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> f;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "  --cache folder     cache the coboundary matrix in the given folder",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  if ((int)CONCAT71(in_register_00000039,no_filtration) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "  --filtration       use the specified algorithm to compute the filtration. Options are:"
               ,0x58);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    pbVar2 = custom_filtration_computer_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (custom_filtration_computer_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        custom_filtration_computer_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar5 = custom_filtration_computer_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar1 = (pbVar5->_M_dataplus)._M_p;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,pcVar1 + pbVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"                         ",0x19);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_50,local_48);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        pbVar5 = pbVar5 + 1;
      } while (pbVar5 != pbVar2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "  --max-dim          the maximal homology dimension to be computed",0x42);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
  std::ostream::put(-0x80);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"  --min-dim          the minimal homology dimension to be computed",0x42);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "  --approximate n    skip all columns creating columns in the reduction matrix with",
             0x53);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "                     n non-trivial entries. Use this for hard problems, a good value",
             0x54);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "                     is often 100000. Increase for higher precision, decrease for faster computation."
             ,0x65);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "  --threads          number of threads to use for the computation (default: number of threads that your machine can execute simultaneously)"
             ,0x8b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return;
}

Assistant:

void print_homology_usage(bool no_filtration = false) {
	std::cerr << "  --cache folder     cache the coboundary matrix in the given folder" << std::endl;
	if (!no_filtration) {
		std::cerr << "  --filtration       use the specified algorithm to compute the filtration. Options are:"
		          << std::endl;

		for (auto f : custom_filtration_computer) std::cerr << "                         " << f << std::endl;
	}

	std::cerr << "  --max-dim          the maximal homology dimension to be computed" << std::endl
	          << "  --min-dim          the minimal homology dimension to be computed" << std::endl
#ifdef USE_COEFFICIENTS
	          << "  --modulus          compute homology with coefficients in the prime field Z/<p>Z" << std::endl
#endif
	          << "  --approximate n    skip all columns creating columns in the reduction matrix with" << std::endl
	          << "                     n non-trivial entries. Use this for hard problems, a good value" << std::endl
	          << "                     is often 100000. Increase for higher precision, decrease for faster computation." << std::endl
	          << "  --threads          number of threads to use for the computation (default: number of threads that your machine can execute simultaneously)" << std::endl
	          << std::endl;
}